

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O3

void kv_get_str_kv_size_test(btree_kv_ops *kv_ops)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ushort *__ptr;
  ushort *__ptr_00;
  char *pcVar4;
  btree *pbVar5;
  ushort uVar6;
  void *__s1;
  int v;
  char str [11];
  timeval __test_begin;
  char acStack_e4 [4];
  long lStack_e0;
  ushort *puStack_d8;
  void *pvStack_d0;
  timeval tStack_c8;
  btree_kv_ops *pbStack_b8;
  undefined4 local_7c;
  char local_78 [16];
  btree local_68;
  timeval local_28;
  
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  memleak_start();
  builtin_strncpy(local_78,"teststring",0xb);
  sVar2 = strlen(local_78);
  local_68.ksize = (uint8_t)sVar2;
  local_68.vsize = 4;
  local_7c = 1;
  sVar3 = (*kv_ops->get_kv_size)(&local_68,local_78,&local_7c);
  sVar2 = strlen(local_78);
  if (sVar3 != sVar2 + 4) {
    kv_get_str_kv_size_test();
  }
  sVar3 = (*kv_ops->get_kv_size)(&local_68,(void *)0x0,&local_7c);
  if (sVar3 != local_68.vsize) {
    kv_get_str_kv_size_test();
  }
  sVar3 = (*kv_ops->get_kv_size)(&local_68,local_78,(void *)0x0);
  sVar2 = strlen(local_78);
  if (sVar3 != sVar2) {
    kv_get_str_kv_size_test();
  }
  pbVar5 = &local_68;
  sVar3 = (*kv_ops->get_kv_size)(pbVar5,(void *)0x0,(void *)0x0);
  if (sVar3 == 0) {
    memleak_end();
    pcVar4 = "%s PASSED\n";
    if (kv_get_str_kv_size_test(btree_kv_ops*)::__test_pass != '\0') {
      pcVar4 = "%s FAILED\n";
    }
    fprintf(_stderr,pcVar4,"kv_get_str_kv_size_test");
    return;
  }
  kv_get_str_kv_size_test();
  pbStack_b8 = kv_ops;
  gettimeofday(&tStack_c8,(__timezone_ptr_t)0x0);
  memleak_start();
  builtin_strncpy(acStack_e4,"key",4);
  sVar2 = strlen(acStack_e4);
  lStack_e0 = 0x40;
  __ptr = (ushort *)malloc(0x1010);
  __ptr[0] = 0;
  __ptr[1] = 0;
  __ptr[2] = 1;
  __ptr[3] = 0;
  uVar6 = (ushort)((int)sVar2 << 8) | 8;
  *__ptr = uVar6;
  puStack_d8 = __ptr + 4;
  *(ushort **)(__ptr + 4) = __ptr + 8;
  __ptr_00 = (ushort *)malloc(0x1010);
  __ptr_00[0] = 0;
  __ptr_00[1] = 0;
  __ptr_00[2] = 1;
  __ptr_00[3] = 0;
  *__ptr_00 = uVar6;
  *(ushort **)(__ptr_00 + 4) = __ptr_00 + 8;
  (*(code *)pbVar5->root_bid)(__ptr_00,0,acStack_e4,&lStack_e0);
  (*(code *)pbVar5->blk_ops)(__ptr,__ptr_00,0,0,1);
  __s1 = *(void **)(__ptr + 4);
  iVar1 = bcmp(__s1,acStack_e4,sVar2 & 0xff);
  if (iVar1 != 0) {
    kv_copy_var_test();
    __s1 = pvStack_d0;
  }
  if (*(long *)((long)__s1 + (sVar2 & 0xff)) != lStack_e0) {
    kv_copy_var_test();
  }
  free(__ptr_00);
  free(__ptr);
  memleak_end();
  pcVar4 = "%s PASSED\n";
  if (kv_copy_var_test(btree_kv_ops*)::__test_pass != '\0') {
    pcVar4 = "%s FAILED\n";
  }
  fprintf(_stderr,pcVar4,"kv_copy_var_test");
  return;
}

Assistant:

void kv_get_str_kv_size_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    btree *tree;
    int v;
    size_t size;
    char str[] = "teststring";

    tree = alca(struct btree, 1);
    tree->ksize = strlen(str);
    tree->vsize = sizeof(v);
    v = 1;

    // get/verify size of kv string
    size = kv_ops->get_kv_size(tree, str, (void *)&v);
    TEST_CHK(size == (strlen(str) + sizeof(v)));

    // verify with NULL key
    size = kv_ops->get_kv_size(tree, NULL, (void *)&v);
    TEST_CHK(size == (tree->vsize));

    // verify with NULL value
    size = kv_ops->get_kv_size(tree,&str, NULL);
    TEST_CHK(size == (strlen(str)));

    // NULL key/value
    size = kv_ops->get_kv_size(tree, NULL, NULL);
    TEST_CHK(size == 0);

    memleak_end();
    TEST_RESULT("kv_get_str_kv_size_test");
}